

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonWriter.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::SkeletonWriter::DoPutSync
          (SkeletonWriter *this,Variable<long_double> *variable,longdouble *data)

{
  BPInfo *in_RDX;
  SkeletonWriter *in_RSI;
  Variable<long_double> *in_RDI;
  size_t in_stack_000001a8;
  size_t in_stack_000001b0;
  longdouble *in_stack_000001b8;
  Variable<long_double> *in_stack_000001c0;
  
  CurrentStep((SkeletonWriter *)in_RDX);
  Variable<long_double>::SetBlockInfo
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
  PutSyncCommon<long_double>(in_RSI,in_RDI,in_RDX);
  std::
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  ::clear((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
           *)0xaa6468);
  return;
}

Assistant:

void SkeletonWriter::Init()
{
    InitParameters();
    InitTransports();
}